

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<ProKey,ProKey>::emplace<ProKey_const&>(QHash<ProKey,ProKey> *this,ProKey *key,ProKey *args)

{
  long in_FS_OFFSET;
  piter pVar1;
  ProKey copy;
  undefined1 local_58 [32];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_58,&key->super_ProString);
  pVar1 = (piter)emplace<ProKey_const&>(this,(ProKey *)local_58,args);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }